

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O2

void FFTProcess<double>(UnityComplexNumber *data,int numsamples,bool forward)

{
  UnityComplexNumber UVar1;
  uint uVar2;
  uint *puVar3;
  UnityComplexNumber *pUVar4;
  uint count;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint j;
  uint m;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  UnityComplexNumber *a;
  ulong uVar11;
  double __x;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_b8;
  double dStack_b0;
  UnityComplexNumberT<double> local_48;
  
  uVar2 = 0;
  for (uVar5 = 1; uVar5 < (uint)numsamples; uVar5 = uVar5 * 2) {
    uVar2 = uVar2 + 1;
  }
  puVar3 = FFTProcess<double>::reversetable[uVar2];
  uVar10 = (ulong)(uint)numsamples;
  if (puVar3 == (uint *)0x0) {
    uVar6 = 0xffffffffffffffff;
    if (-1 < numsamples) {
      uVar6 = uVar10 * 4;
    }
    puVar3 = (uint *)operator_new__(uVar6);
    for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
      uVar7 = 0;
      uVar5 = 1;
      for (uVar8 = numsamples >> 1; uVar8 != 0; uVar8 = uVar8 >> 1) {
        uVar9 = uVar8 & (uint)uVar6;
        if (uVar9 != 0) {
          uVar9 = uVar5;
        }
        uVar7 = uVar7 | uVar9;
        uVar5 = uVar5 * 2;
      }
      puVar3[uVar6] = uVar7;
    }
    FFTProcess<double>::reversetable[uVar2] = puVar3;
  }
  for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
    uVar11 = (ulong)puVar3[uVar6];
    if (uVar6 < uVar11) {
      UVar1 = data[uVar6];
      data[uVar6] = data[uVar11];
      data[uVar11] = UVar1;
    }
  }
  if (forward) {
    __x = -3.141592653589793;
  }
  else {
    __x = 3.141592653589793;
  }
  uVar5 = 1;
  while ((int)uVar5 < numsamples) {
    dVar12 = cos(__x);
    dVar13 = sin(__x);
    uVar2 = uVar5 * 2;
    uVar10 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar10 = 0;
    }
    local_b8 = 1.0;
    dStack_b0 = 0.0;
    pUVar4 = data;
    for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
      a = pUVar4;
      for (uVar11 = uVar6; (long)uVar11 < (long)numsamples; uVar11 = uVar11 + (long)(int)uVar2) {
        dVar14 = (double)a[(int)uVar5].re;
        dVar15 = (double)a[(int)uVar5].im;
        local_48.re = dVar14 * local_b8 + -dStack_b0 * dVar15;
        local_48.im = dVar15 * local_b8 + dStack_b0 * dVar14;
        UnityComplexNumberT<float>::Sub<float,double,float>(a,&local_48,a + (int)uVar5);
        UnityComplexNumberT<float>::Add<float,double,float>(a,&local_48,a);
        a = a + (int)uVar2;
      }
      dVar14 = local_b8 * dVar13;
      local_b8 = -dStack_b0 * dVar13 + local_b8 * dVar12;
      dStack_b0 = dStack_b0 * dVar12 + dVar14;
      pUVar4 = pUVar4 + 1;
    }
    __x = __x * 0.5;
    uVar5 = uVar2;
  }
  return;
}

Assistant:

static void FFTProcess(UnityComplexNumber* data, int numsamples, bool forward)
{
    unsigned int count = 1, numbits = 0;
    while (count < numsamples)
    {
        count += count;
        ++numbits;
    }

    static unsigned int* reversetable[32] = { NULL };
    unsigned int* tbl = reversetable[numbits];
    if (tbl == NULL)
    {
        tbl = new unsigned int[numsamples];
        for (unsigned int n = 0; n < numsamples; n++)
        {
            unsigned int j = 1, k = 0, m = numsamples >> 1;
            while (m > 0)
            {
                if (n & m)
                    k |= j;
                j += j;
                m >>= 1;
            }
            tbl[n] = k;
        }
#if ENABLE_TESTS
        for (unsigned int n = 0; n < numsamples; n++)
        {
            assert(tbl[tbl[n]] == n);
        }
#endif
        reversetable[numbits] = tbl;
    }

    for (unsigned int i = 0; i < numsamples; i++)
    {
        unsigned int j = tbl[i];
        if (i < j)
        {
            UnitySwap(data[i].re, data[j].re);
            UnitySwap(data[i].im, data[j].im);
        }
    }

    T w0 = (forward) ? -T(kPI_double) : T(kPI_double);
    for (int j = 1; j < numsamples; j += j)
    {
        UnityComplexNumberT<T> wr, wd;
        wr.Set(T(cos(w0)), T(sin(w0)));
        wd.Set(T(1.0), T(0.0));
        int step = j + j;
        for (int m = 0; m < j; ++m)
        {
            for (int i = m; i < numsamples; i += step)
            {
                UnityComplexNumberT<T> t;
                UnityComplexNumber::Mul(wd, data[i + j], t);
                UnityComplexNumber::Sub(data[i], t, data[i + j]);
                UnityComplexNumber::Add(data[i], t, data[i]);
            }
            UnityComplexNumber::Mul(wd, wr, wd);
        }
        w0 *= T(0.5);
    }
}